

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  curl_llist *pcVar7;
  void *pvVar8;
  int in_EDX;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  Curl_multi *pCVar14;
  ulong uVar15;
  curl_socket_t socks [5];
  int actions [5];
  int local_a4;
  Curl_easy *local_a0;
  curl_hash *local_98;
  Curl_multi *local_90;
  int *local_88;
  int local_7c;
  curl_llist_element *local_78;
  curl_socket_t *local_70;
  curl_socket_t local_68 [8];
  uint local_48 [6];
  
  local_68[0] = -1;
  local_68[1] = 0xffffffff;
  local_68[2] = 0xffffffff;
  local_68[3] = 0xffffffff;
  local_68[4] = 0xffffffff;
  uVar5 = multi_getsock(data,local_68,in_EDX);
  local_98 = &multi->sockhash;
  local_70 = data->sockets;
  local_88 = data->actions;
  local_78 = &data->sh_queue;
  uVar15 = 0;
  local_a0 = data;
  local_90 = multi;
  do {
    bVar4 = (byte)uVar15;
    uVar9 = 1 << (bVar4 + 0x10 & 0x1f);
    uVar13 = (uint)uVar15;
    if ((uVar5 >> (bVar4 & 0x1f) & 0x10001) == 0) break;
    uVar12 = 1 << (bVar4 & 0x1f);
    iVar2 = local_68[(int)uVar13];
    local_a4 = iVar2;
    if (iVar2 == -1) {
      pcVar7 = (curl_llist *)0x0;
    }
    else {
      pcVar7 = (curl_llist *)Curl_hash_pick(local_98,&local_a4,4);
    }
    uVar3 = (uint)((uVar12 & uVar5) != 0);
    uVar6 = uVar3 + 2;
    if ((uVar9 & uVar5) == 0) {
      uVar6 = uVar3;
    }
    local_48[(int)uVar13] = uVar6;
    if (pcVar7 == (curl_llist *)0x0) {
      local_a4 = iVar2;
      local_7c = iVar2;
      if ((iVar2 == -1) ||
         (pcVar7 = (curl_llist *)Curl_hash_pick(local_98,&local_a4,4), pcVar7 == (curl_llist *)0x0))
      {
        pcVar7 = (curl_llist *)(*Curl_ccalloc)(1,0x40);
        if (pcVar7 == (curl_llist *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_llist_init(pcVar7,(curl_llist_dtor)0x0);
        pvVar8 = Curl_hash_add(local_98,&local_7c,4,pcVar7);
        if (pvVar8 == (void *)0x0) {
          (*Curl_cfree)(pcVar7);
          return CURLM_OUT_OF_MEMORY;
        }
      }
    }
    else {
      uVar13 = local_a0->numsocks;
      if ((int)uVar13 < 1) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        do {
          if (iVar2 == local_88[uVar15 - 5]) {
            uVar13 = local_88[uVar15];
            pCVar14 = local_90;
            if (uVar13 != uVar6) {
              if ((uVar13 & 1) != 0) {
                piVar1 = (int *)((long)&pcVar7[1].dtor + 4);
                *piVar1 = *piVar1 + -1;
              }
              if ((uVar13 & 2) != 0) {
                *(int *)&pcVar7[1].size = (int)pcVar7[1].size + -1;
              }
              if ((uVar5 & uVar12) != 0) {
                piVar1 = (int *)((long)&pcVar7[1].dtor + 4);
                *piVar1 = *piVar1 + 1;
              }
              if ((uVar5 & uVar9) != 0) {
                *(int *)&pcVar7[1].size = (int)pcVar7[1].size + 1;
              }
            }
            goto LAB_001295ba;
          }
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
        uVar15 = (ulong)uVar13;
      }
    }
    pCVar14 = local_90;
    *(int *)&pcVar7[1].dtor = *(int *)&pcVar7[1].dtor + 1;
    if ((uVar5 & uVar12) != 0) {
      piVar1 = (int *)((long)&pcVar7[1].dtor + 4);
      *piVar1 = *piVar1 + 1;
    }
    if ((uVar5 & uVar9) != 0) {
      *(int *)&pcVar7[1].size = (int)pcVar7[1].size + 1;
    }
    Curl_llist_insert_next(pcVar7,pcVar7->tail,local_a0,local_78);
LAB_001295ba:
    iVar10 = (uint)(*(int *)((long)&pcVar7[1].dtor + 4) != 0) + (uint)((int)pcVar7[1].size != 0) * 2
    ;
    if (*(int *)&pcVar7[1].head != iVar10) {
      if (pCVar14->socket_cb != (curl_socket_callback)0x0) {
        (*pCVar14->socket_cb)(local_a0,iVar2,iVar10,pCVar14->socket_userp,pcVar7[1].tail);
      }
      *(int *)&pcVar7[1].head = iVar10;
    }
    iVar2 = (int)uVar15;
    uVar13 = iVar2 + 1;
    uVar15 = (ulong)uVar13;
  } while (iVar2 < 4);
  if (0 < local_a0->numsocks) {
    lVar11 = 0;
    do {
      iVar2 = local_70[lVar11];
      if (0 < (int)uVar13) {
        uVar15 = 0;
        do {
          if (iVar2 == local_68[uVar15]) goto LAB_00129724;
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      local_a4 = iVar2;
      if ((iVar2 != -1) &&
         (pcVar7 = (curl_llist *)Curl_hash_pick(local_98,&local_a4,4), pcVar7 != (curl_llist *)0x0))
      {
        uVar5 = local_88[lVar11];
        iVar10 = *(int *)&pcVar7[1].dtor + -1;
        *(int *)&pcVar7[1].dtor = iVar10;
        if ((uVar5 & 2) != 0) {
          *(int *)&pcVar7[1].size = (int)pcVar7[1].size + -1;
        }
        if ((uVar5 & 1) != 0) {
          piVar1 = (int *)((long)&pcVar7[1].dtor + 4);
          *piVar1 = *piVar1 + -1;
        }
        if (iVar10 == 0) {
          if (local_90->socket_cb != (curl_socket_callback)0x0) {
            (*local_90->socket_cb)(local_a0,iVar2,4,local_90->socket_userp,pcVar7[1].tail);
          }
          local_a4 = iVar2;
          Curl_hash_delete(local_98,&local_a4,4);
        }
        else {
          Curl_llist_remove(pcVar7,local_78,(void *)0x0);
        }
      }
LAB_00129724:
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_a0->numsocks);
  }
  memcpy(local_70,local_68,(long)(int)uVar13 << 2);
  memcpy(local_88,local_48,(long)(int)uVar13 << 2);
  local_a0->numsocks = uVar13;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      for(i = 0; i< data->numsocks; i++) {
        if(s == data->sockets[i]) {
          prevaction = data->actions[i];
          sincebefore = TRUE;
          break;
        }
      }

    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the list of handles using this socket! */
      Curl_llist_insert_next(&entry->list, entry->list.tail,
                             data, &data->sh_queue);
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

#if 0
    infof(data, "--- Comboaction: %u readers %u writers\n",
          entry->readers, entry->writers);
#endif
    /* check if it has the same action set */
    if(entry->action == comboaction)
      /* same, continue */
      continue;

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       comboaction,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
      else {
        /* remove this transfer as a user of this socket */
        Curl_llist_remove(&entry->list, &data->sh_queue, NULL);
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}